

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZone::OffsetData>::emplace<QTimeZone::OffsetData>
          (QMovableArrayOps<QTimeZone::OffsetData> *this,qsizetype i,OffsetData *args)

{
  OffsetData **ppOVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  OffsetData tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
           super_QArrayDataPointer<QTimeZone::OffsetData>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QTimeZone::OffsetData>).
        super_QArrayDataPointer<QTimeZone::OffsetData>.size == i) {
      qVar5 = QArrayDataPointer<QTimeZone::OffsetData>::freeSpaceAtEnd
                        ((QArrayDataPointer<QTimeZone::OffsetData> *)this);
      if (qVar5 == 0) goto LAB_003178a9;
      QTimeZone::OffsetData::OffsetData
                ((this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                 super_QArrayDataPointer<QTimeZone::OffsetData>.ptr +
                 (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                 super_QArrayDataPointer<QTimeZone::OffsetData>.size,args);
LAB_00317998:
      pqVar2 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                super_QArrayDataPointer<QTimeZone::OffsetData>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00317957;
    }
LAB_003178a9:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QTimeZone::OffsetData>::freeSpaceAtBegin
                        ((QArrayDataPointer<QTimeZone::OffsetData> *)this);
      if (qVar5 != 0) {
        QTimeZone::OffsetData::OffsetData
                  ((this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                   super_QArrayDataPointer<QTimeZone::OffsetData>.ptr + -1,args);
        ppOVar1 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                   super_QArrayDataPointer<QTimeZone::OffsetData>.ptr;
        *ppOVar1 = *ppOVar1 + -1;
        goto LAB_00317998;
      }
    }
  }
  tmp._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.abbreviation.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.atUtc.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  tmp.abbreviation.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QTimeZone::OffsetData::OffsetData(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
          super_QArrayDataPointer<QTimeZone::OffsetData>.size != 0;
  QArrayDataPointer<QTimeZone::OffsetData>::detachAndGrow
            ((QArrayDataPointer<QTimeZone::OffsetData> *)this,(uint)(i == 0 && bVar6),1,
             (OffsetData **)0x0,(QArrayDataPointer<QTimeZone::OffsetData> *)0x0);
  if (i == 0 && bVar6) {
    QTimeZone::OffsetData::OffsetData
              ((this->super_QGenericArrayOps<QTimeZone::OffsetData>).
               super_QArrayDataPointer<QTimeZone::OffsetData>.ptr + -1,&tmp);
    ppOVar1 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
               super_QArrayDataPointer<QTimeZone::OffsetData>.ptr;
    *ppOVar1 = *ppOVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
              super_QArrayDataPointer<QTimeZone::OffsetData>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QTimeZone::OffsetData> *)this,i,1);
    QTimeZone::OffsetData::OffsetData(local_80.displaceFrom,&tmp);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QTimeZone::OffsetData::~OffsetData(&tmp);
LAB_00317957:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }